

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::MILSpec::Operation::ByteSizeLong(Operation *this)

{
  Rep *pRVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  void **ppvVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  const_iterator it;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  local_58;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  local_40;
  
  local_40.m_ = (InnerMap *)&this->inputs_;
  uVar9 = (ulong)(uint)(this->inputs_).map_.elements_.num_elements_;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
  ::InnerMap::
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
  ::SearchFrom((iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
                *)&local_40,(this->inputs_).map_.elements_.index_of_first_non_null_);
  local_58.m_ = local_40.m_;
  local_58.node_ = local_40.node_;
  while (local_58.node_ != (Node *)0x0) {
    sVar4 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_58.node_,(Argument *)&(local_58.node_)->field_0x20);
    uVar9 = uVar9 + sVar4;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
    ::InnerMap::
    iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
    ::operator++((iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_>
                  *)&local_58);
  }
  lVar8 = (long)(this->outputs_).super_RepeatedPtrFieldBase.current_size_;
  lVar10 = uVar9 + lVar8;
  pRVar1 = (this->outputs_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  local_58.node_ = (Node *)0x0;
  if (lVar8 != 0) {
    lVar7 = 0;
    do {
      sVar4 = NamedValueType::ByteSizeLong(*(NamedValueType **)((long)ppvVar6 + lVar7));
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar10 = lVar10 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      lVar7 = lVar7 + 8;
    } while (lVar8 * 8 != lVar7);
  }
  lVar8 = (long)(this->blocks_).super_RepeatedPtrFieldBase.current_size_;
  lVar10 = lVar10 + lVar8;
  pRVar1 = (this->blocks_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  if (lVar8 != 0) {
    lVar7 = 0;
    do {
      sVar4 = Block::ByteSizeLong(*(Block **)((long)ppvVar6 + lVar7));
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar10 = lVar10 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      lVar7 = lVar7 + 8;
    } while (lVar8 * 8 != lVar7);
  }
  local_40.m_ = (InnerMap *)&this->attributes_;
  sVar4 = (ulong)(uint)(this->attributes_).map_.elements_.num_elements_ + lVar10;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::InnerMap::
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
  ::SearchFrom(&local_40,(this->attributes_).map_.elements_.index_of_first_non_null_);
  local_58.m_ = local_40.m_;
  local_58.node_ = local_40.node_;
  while (local_58.node_ != (Node *)0x0) {
    sVar5 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_58.node_,(Value *)&(local_58.node_)->field_0x20);
    sVar4 = sVar4 + sVar5;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
    ::InnerMap::
    iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_>
    ::operator++(&local_58);
  }
  lVar8 = *(long *)(((ulong)(this->type_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  if (lVar8 != 0) {
    uVar3 = (uint)lVar8 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + lVar8 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  uVar9 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar9 & 1) != 0) {
    sVar4 = sVar4 + *(long *)((uVar9 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar4;
  return sVar4;
}

Assistant:

size_t Operation::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Operation)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // map<string, .CoreML.Specification.MILSpec.Argument> inputs = 2;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_inputs_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Argument >::const_iterator
      it = this->_internal_inputs().begin();
      it != this->_internal_inputs().end(); ++it) {
    total_size += Operation_InputsEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  // repeated .CoreML.Specification.MILSpec.NamedValueType outputs = 3;
  total_size += 1UL * this->_internal_outputs_size();
  for (const auto& msg : this->outputs_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.MILSpec.Block blocks = 4;
  total_size += 1UL * this->_internal_blocks_size();
  for (const auto& msg : this->blocks_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // map<string, .CoreML.Specification.MILSpec.Value> attributes = 5;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_attributes_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
      it = this->_internal_attributes().begin();
      it != this->_internal_attributes().end(); ++it) {
    total_size += Operation_AttributesEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  // string type = 1;
  if (!this->_internal_type().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_type());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}